

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O1

void __thiscall soplex::SVSetBase<double>::memRemax(SVSetBase<double> *this,int newmax)

{
  DLPSV *pDVar1;
  ptrdiff_t pVar2;
  int iVar3;
  DLPSV *pDVar4;
  DLPSV *pDVar5;
  
  pVar2 = ClassArray<soplex::Nonzero<double>_>::reMax
                    (&this->super_ClassArray<soplex::Nonzero<double>_>,newmax,-1);
  if (pVar2 != 0) {
    pDVar4 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first;
    if (pDVar4 == (DLPSV *)0x0) {
      iVar3 = 0;
    }
    else {
      pDVar1 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
      iVar3 = 0;
      do {
        (pDVar4->super_SVectorBase<double>).m_elem =
             (Nonzero<double> *)((long)&((pDVar4->super_SVectorBase<double>).m_elem)->val + pVar2);
        if (pDVar1 == pDVar4) {
          pDVar5 = (DLPSV *)0x0;
        }
        else {
          pDVar5 = pDVar4->thenext;
        }
        iVar3 = iVar3 + (pDVar4->super_SVectorBase<double>).memused;
        pDVar4 = pDVar5;
      } while (pDVar5 != (DLPSV *)0x0);
    }
    this->unusedMem = (this->super_ClassArray<soplex::Nonzero<double>_>).thesize - iVar3;
    this->numUnusedMemUpdates = 0;
  }
  return;
}

Assistant:

void memRemax(int newmax)
   {
      ptrdiff_t delta = SVSetBaseArray::reMax(newmax);

      if(delta != 0)
      {
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this,
                       "counting unused memory (unusedMem = {}, numUnusedMemUpdates = {}, this = {})\n",
                       unusedMem, numUnusedMemUpdates, (void*)this);
#endif

         int used = 0;

         for(DLPSV* ps = list.first(); ps; ps = list.next(ps))
         {
            // get new shifted nonzero memory of the SVectorBase
            Nonzero<R>* newmem = reinterpret_cast<Nonzero<R>*>(reinterpret_cast<char*>(ps->mem()) + delta);

            // get the size and maximum capacity of the SVectorBase
            int sz = ps->size();
            int l_max = ps->max();
            assert(l_max >= sz);

            // set new nonzero memory
            ps->setMem(l_max, newmem);
            ps->set_size(sz);

            // count used memory
            used += sz;
         }

         // update estimation of unused memory to exact value
         unusedMem = memSize() - used;
         numUnusedMemUpdates = 0;

#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "               --> NEW: unusedMem = {}, after memRemax({})\n", unusedMem,
                       newmax);
#endif
      }
   }